

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mustache.cpp
# Opt level: O1

void __thiscall TestMustache::testFalsiness(TestMustache *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  qsizetype qVar7;
  char cVar8;
  QVariant *pQVar9;
  QVariant *pQVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QVariant moved;
  QVariantHash data;
  QString output;
  QVariant moved_1;
  QString _template;
  QtVariantContext context;
  Renderer renderer;
  undefined1 local_1c8 [24];
  QVariant *pQStack_1b0;
  Data *local_1a8;
  QHash<QString,_QVariant> local_1a0;
  anon_union_24_3_e3d07ef4_for_data local_198;
  undefined8 uStack_180;
  QString local_170;
  QString local_158;
  anon_union_24_3_e3d07ef4_for_data local_138;
  QVariant *pQStack_120;
  QString local_118;
  QtVariantContext local_f8;
  Renderer local_c8;
  
  Mustache::Renderer::Renderer(&local_c8);
  local_1a0.d = (Data *)0x0;
  QVar11.m_data = (storage_type *)0x2a;
  QVar11.m_size = (qsizetype)&local_f8;
  QString::fromUtf8(QVar11);
  local_118.d.d = (Data *)local_f8.super_Context._vptr_Context;
  local_118.d.ptr = (char16_t *)local_f8.super_Context.m_partialResolver;
  local_118.d.size = (qsizetype)local_f8.m_contextStack.super_QList<QVariant>.d.d;
  ::QVariant::QVariant((QVariant *)&local_138,0);
  QVar12.m_data = (storage_type *)0x4;
  QVar12.m_size = (qsizetype)&local_f8;
  QString::fromUtf8(QVar12);
  local_198.shared = (PrivateShared *)local_f8.super_Context._vptr_Context;
  local_198._8_8_ = local_f8.super_Context.m_partialResolver;
  local_198._16_8_ = local_f8.m_contextStack.super_QList<QVariant>.d.d;
  pQVar9 = QHash<QString,_QVariant>::operator[](&local_1a0,(QString *)&local_198);
  pQVar10 = pQStack_120;
  uVar3 = local_138._16_8_;
  uVar2 = local_138._8_8_;
  uVar1 = local_138.shared;
  local_138.shared = (PrivateShared *)0x0;
  local_138._8_8_ = 0;
  local_138._16_8_ = (QArrayData *)0x0;
  pQStack_120 = (QVariant *)0x2;
  local_1c8._0_8_ = (pQVar9->d).data.shared;
  local_1c8._8_8_ = *(undefined8 *)((long)&(pQVar9->d).data + 8);
  local_1c8._16_8_ = *(undefined8 *)((long)&(pQVar9->d).data + 0x10);
  pQStack_1b0 = *(QVariant **)&(pQVar9->d).field_0x18;
  *(undefined8 *)((long)&(pQVar9->d).data + 0x10) = uVar3;
  *(QVariant **)&(pQVar9->d).field_0x18 = pQVar10;
  (pQVar9->d).data.shared = (PrivateShared *)uVar1;
  *(undefined8 *)((long)&(pQVar9->d).data + 8) = uVar2;
  local_f8.super_Context._vptr_Context = (_func_int **)local_1c8._0_8_;
  local_f8.super_Context.m_partialResolver = (PartialResolver *)local_1c8._8_8_;
  local_f8.m_contextStack.super_QList<QVariant>.d.d = (Data *)local_1c8._16_8_;
  local_f8.m_contextStack.super_QList<QVariant>.d.ptr = pQStack_1b0;
  ::QVariant::~QVariant((QVariant *)local_1c8);
  if ((QArrayData *)local_198.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_198.shared = *(int *)local_198.shared + -1;
    UNLOCK();
    if (*(int *)local_198.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_198.shared,2,8);
    }
  }
  ::QVariant::~QVariant((QVariant *)&local_138);
  ::QVariant::QVariant((QVariant *)local_1c8,(QHash *)&local_1a0);
  Mustache::QtVariantContext::QtVariantContext
            (&local_f8,(QVariant *)local_1c8,(PartialResolver *)0x0);
  ::QVariant::~QVariant((QVariant *)local_1c8);
  Mustache::Renderer::render(&local_170,&local_c8,&local_118,&local_f8.super_Context);
  if ((QArrayData *)local_170.d.size == (QArrayData *)0x0) {
    cVar8 = QTest::qVerify(true,"output.isEmpty()","0 evaluated as truthy",
                           "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                           ,0x8c);
  }
  else {
    cVar8 = QTest::qVerify(false,"output.isEmpty()","0 evaluated as truthy",
                           "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                           ,0x8c);
  }
  if (cVar8 != '\0') {
    ::QVariant::QVariant((QVariant *)&local_198,0);
    QVar13.m_data = (storage_type *)0x4;
    QVar13.m_size = (qsizetype)local_1c8;
    QString::fromUtf8(QVar13);
    local_158.d.d = (Data *)local_1c8._0_8_;
    local_158.d.ptr = (char16_t *)local_1c8._8_8_;
    local_158.d.size = local_1c8._16_8_;
    pQVar10 = QHash<QString,_QVariant>::operator[](&local_1a0,&local_158);
    uVar4 = uStack_180;
    uVar3 = local_198._16_8_;
    uVar2 = local_198._8_8_;
    uVar1 = local_198.shared;
    local_198.shared = (PrivateShared *)0x0;
    local_198._8_8_ = 0;
    local_198._16_8_ = 0;
    uStack_180 = 2;
    local_1c8._0_8_ = (pQVar10->d).data.shared;
    local_1c8._8_8_ = *(undefined8 *)((long)&(pQVar10->d).data + 8);
    local_1c8._16_8_ = *(undefined8 *)((long)&(pQVar10->d).data + 0x10);
    pQStack_1b0 = *(QVariant **)&(pQVar10->d).field_0x18;
    *(undefined8 *)((long)&(pQVar10->d).data + 0x10) = uVar3;
    *(undefined8 *)&(pQVar10->d).field_0x18 = uVar4;
    (pQVar10->d).data.shared = (PrivateShared *)uVar1;
    *(undefined8 *)((long)&(pQVar10->d).data + 8) = uVar2;
    local_138.shared = (PrivateShared *)local_1c8._0_8_;
    local_138._8_8_ = local_1c8._8_8_;
    local_138._16_8_ = local_1c8._16_8_;
    pQStack_120 = pQStack_1b0;
    ::QVariant::~QVariant((QVariant *)&local_138);
    if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,2,8);
      }
    }
    ::QVariant::~QVariant((QVariant *)&local_198);
    ::QVariant::QVariant((QVariant *)&local_138,(QHash *)&local_1a0);
    Mustache::QtVariantContext::QtVariantContext
              ((QtVariantContext *)local_1c8,(QVariant *)&local_138,(PartialResolver *)0x0);
    local_198._16_8_ = local_f8.m_contextStack.super_QList<QVariant>.d.size;
    local_198._8_8_ = local_f8.m_contextStack.super_QList<QVariant>.d.ptr;
    local_198.shared = (PrivateShared *)local_f8.m_contextStack.super_QList<QVariant>.d.d;
    local_f8.m_contextStack.super_QList<QVariant>.d.size = (qsizetype)local_1a8;
    local_f8.m_contextStack.super_QList<QVariant>.d.ptr = pQStack_1b0;
    local_f8.super_Context.m_partialResolver = (PartialResolver *)local_1c8._8_8_;
    local_f8.m_contextStack.super_QList<QVariant>.d.d = (Data *)local_1c8._16_8_;
    local_1c8._16_8_ = (QArrayData *)0x0;
    pQStack_1b0 = (QVariant *)0x0;
    local_1a8 = (Data *)0x0;
    QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)&local_198);
    local_1c8._0_8_ = &PTR__QtVariantContext_00122c90;
    QArrayDataPointer<QVariant>::~QArrayDataPointer
              ((QArrayDataPointer<QVariant> *)(local_1c8 + 0x10));
    ::QVariant::~QVariant((QVariant *)&local_138);
    Mustache::Renderer::render((QString *)local_1c8,&local_c8,&local_118,&local_f8.super_Context);
    qVar7 = local_170.d.size;
    pcVar6 = local_170.d.ptr;
    pDVar5 = local_170.d.d;
    local_170.d.d = (Data *)local_1c8._0_8_;
    local_1c8._0_8_ = pDVar5;
    local_170.d.ptr = (char16_t *)local_1c8._8_8_;
    local_170.d.size = local_1c8._16_8_;
    local_1c8._8_8_ = pcVar6;
    local_1c8._16_8_ = qVar7;
    if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar5->super_QArrayData,2,8);
      }
    }
    if ((QArrayData *)local_170.d.size == (QArrayData *)0x0) {
      cVar8 = QTest::qVerify(true,"output.isEmpty()","0u evaluated as truthy",
                             "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                             ,0x92);
    }
    else {
      cVar8 = QTest::qVerify(false,"output.isEmpty()","0u evaluated as truthy",
                             "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                             ,0x92);
    }
    if (cVar8 != '\0') {
      ::QVariant::QVariant((QVariant *)&local_198,0);
      QVar14.m_data = (storage_type *)0x4;
      QVar14.m_size = (qsizetype)local_1c8;
      QString::fromUtf8(QVar14);
      local_158.d.d = (Data *)local_1c8._0_8_;
      local_158.d.ptr = (char16_t *)local_1c8._8_8_;
      local_158.d.size = local_1c8._16_8_;
      pQVar10 = QHash<QString,_QVariant>::operator[](&local_1a0,&local_158);
      uVar4 = uStack_180;
      uVar3 = local_198._16_8_;
      uVar2 = local_198._8_8_;
      uVar1 = local_198.shared;
      local_198.shared = (PrivateShared *)0x0;
      local_198._8_8_ = 0;
      local_198._16_8_ = 0;
      uStack_180 = 2;
      local_1c8._0_8_ = (pQVar10->d).data.shared;
      local_1c8._8_8_ = *(undefined8 *)((long)&(pQVar10->d).data + 8);
      local_1c8._16_8_ = *(undefined8 *)((long)&(pQVar10->d).data + 0x10);
      pQStack_1b0 = *(QVariant **)&(pQVar10->d).field_0x18;
      *(undefined8 *)((long)&(pQVar10->d).data + 0x10) = uVar3;
      *(undefined8 *)&(pQVar10->d).field_0x18 = uVar4;
      (pQVar10->d).data.shared = (PrivateShared *)uVar1;
      *(undefined8 *)((long)&(pQVar10->d).data + 8) = uVar2;
      local_138.shared = (PrivateShared *)local_1c8._0_8_;
      local_138._8_8_ = local_1c8._8_8_;
      local_138._16_8_ = local_1c8._16_8_;
      pQStack_120 = pQStack_1b0;
      ::QVariant::~QVariant((QVariant *)&local_138);
      if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,2,8);
        }
      }
      ::QVariant::~QVariant((QVariant *)&local_198);
      ::QVariant::QVariant((QVariant *)&local_138,(QHash *)&local_1a0);
      Mustache::QtVariantContext::QtVariantContext
                ((QtVariantContext *)local_1c8,(QVariant *)&local_138,(PartialResolver *)0x0);
      local_198._16_8_ = local_f8.m_contextStack.super_QList<QVariant>.d.size;
      local_198._8_8_ = local_f8.m_contextStack.super_QList<QVariant>.d.ptr;
      local_198.shared = (PrivateShared *)local_f8.m_contextStack.super_QList<QVariant>.d.d;
      local_f8.m_contextStack.super_QList<QVariant>.d.size = (qsizetype)local_1a8;
      local_f8.m_contextStack.super_QList<QVariant>.d.ptr = pQStack_1b0;
      local_f8.super_Context.m_partialResolver = (PartialResolver *)local_1c8._8_8_;
      local_f8.m_contextStack.super_QList<QVariant>.d.d = (Data *)local_1c8._16_8_;
      local_1c8._16_8_ = (QArrayData *)0x0;
      pQStack_1b0 = (QVariant *)0x0;
      local_1a8 = (Data *)0x0;
      QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)&local_198);
      local_1c8._0_8_ = &PTR__QtVariantContext_00122c90;
      QArrayDataPointer<QVariant>::~QArrayDataPointer
                ((QArrayDataPointer<QVariant> *)(local_1c8 + 0x10));
      ::QVariant::~QVariant((QVariant *)&local_138);
      Mustache::Renderer::render((QString *)local_1c8,&local_c8,&local_118,&local_f8.super_Context);
      qVar7 = local_170.d.size;
      pcVar6 = local_170.d.ptr;
      pDVar5 = local_170.d.d;
      local_170.d.d = (Data *)local_1c8._0_8_;
      local_1c8._0_8_ = pDVar5;
      local_170.d.ptr = (char16_t *)local_1c8._8_8_;
      local_170.d.size = local_1c8._16_8_;
      local_1c8._8_8_ = pcVar6;
      local_1c8._16_8_ = qVar7;
      if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar5->super_QArrayData,2,8);
        }
      }
      if ((QArrayData *)local_170.d.size == (QArrayData *)0x0) {
        cVar8 = QTest::qVerify(true,"output.isEmpty()","0ll evaluated as truthy",
                               "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                               ,0x98);
      }
      else {
        cVar8 = QTest::qVerify(false,"output.isEmpty()","0ll evaluated as truthy",
                               "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                               ,0x98);
      }
      if (cVar8 != '\0') {
        ::QVariant::QVariant((QVariant *)&local_198,0);
        QVar15.m_data = (storage_type *)0x4;
        QVar15.m_size = (qsizetype)local_1c8;
        QString::fromUtf8(QVar15);
        local_158.d.d = (Data *)local_1c8._0_8_;
        local_158.d.ptr = (char16_t *)local_1c8._8_8_;
        local_158.d.size = local_1c8._16_8_;
        pQVar10 = QHash<QString,_QVariant>::operator[](&local_1a0,&local_158);
        uVar4 = uStack_180;
        uVar3 = local_198._16_8_;
        uVar2 = local_198._8_8_;
        uVar1 = local_198.shared;
        local_198.shared = (PrivateShared *)0x0;
        local_198._8_8_ = 0;
        local_198._16_8_ = 0;
        uStack_180 = 2;
        local_1c8._0_8_ = (pQVar10->d).data.shared;
        local_1c8._8_8_ = *(undefined8 *)((long)&(pQVar10->d).data + 8);
        local_1c8._16_8_ = *(undefined8 *)((long)&(pQVar10->d).data + 0x10);
        pQStack_1b0 = *(QVariant **)&(pQVar10->d).field_0x18;
        *(undefined8 *)((long)&(pQVar10->d).data + 0x10) = uVar3;
        *(undefined8 *)&(pQVar10->d).field_0x18 = uVar4;
        (pQVar10->d).data.shared = (PrivateShared *)uVar1;
        *(undefined8 *)((long)&(pQVar10->d).data + 8) = uVar2;
        local_138.shared = (PrivateShared *)local_1c8._0_8_;
        local_138._8_8_ = local_1c8._8_8_;
        local_138._16_8_ = local_1c8._16_8_;
        pQStack_120 = pQStack_1b0;
        ::QVariant::~QVariant((QVariant *)&local_138);
        if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,2,8);
          }
        }
        ::QVariant::~QVariant((QVariant *)&local_198);
        ::QVariant::QVariant((QVariant *)&local_138,(QHash *)&local_1a0);
        Mustache::QtVariantContext::QtVariantContext
                  ((QtVariantContext *)local_1c8,(QVariant *)&local_138,(PartialResolver *)0x0);
        local_198._16_8_ = local_f8.m_contextStack.super_QList<QVariant>.d.size;
        local_198._8_8_ = local_f8.m_contextStack.super_QList<QVariant>.d.ptr;
        local_198.shared = (PrivateShared *)local_f8.m_contextStack.super_QList<QVariant>.d.d;
        local_f8.m_contextStack.super_QList<QVariant>.d.size = (qsizetype)local_1a8;
        local_f8.m_contextStack.super_QList<QVariant>.d.ptr = pQStack_1b0;
        local_f8.super_Context.m_partialResolver = (PartialResolver *)local_1c8._8_8_;
        local_f8.m_contextStack.super_QList<QVariant>.d.d = (Data *)local_1c8._16_8_;
        local_1c8._16_8_ = (QArrayData *)0x0;
        pQStack_1b0 = (QVariant *)0x0;
        local_1a8 = (Data *)0x0;
        QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)&local_198);
        local_1c8._0_8_ = &PTR__QtVariantContext_00122c90;
        QArrayDataPointer<QVariant>::~QArrayDataPointer
                  ((QArrayDataPointer<QVariant> *)(local_1c8 + 0x10));
        ::QVariant::~QVariant((QVariant *)&local_138);
        Mustache::Renderer::render
                  ((QString *)local_1c8,&local_c8,&local_118,&local_f8.super_Context);
        qVar7 = local_170.d.size;
        pcVar6 = local_170.d.ptr;
        pDVar5 = local_170.d.d;
        local_170.d.d = (Data *)local_1c8._0_8_;
        local_1c8._0_8_ = pDVar5;
        local_170.d.ptr = (char16_t *)local_1c8._8_8_;
        local_170.d.size = local_1c8._16_8_;
        local_1c8._8_8_ = pcVar6;
        local_1c8._16_8_ = qVar7;
        if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar5->super_QArrayData,2,8);
          }
        }
        if ((QArrayData *)local_170.d.size == (QArrayData *)0x0) {
          cVar8 = QTest::qVerify(true,"output.isEmpty()","0ull evaluated as truthy",
                                 "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                                 ,0x9e);
        }
        else {
          cVar8 = QTest::qVerify(false,"output.isEmpty()","0ull evaluated as truthy",
                                 "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                                 ,0x9e);
        }
        if (cVar8 != '\0') {
          ::QVariant::QVariant((QVariant *)&local_198,0.0);
          QVar16.m_data = (storage_type *)0x4;
          QVar16.m_size = (qsizetype)local_1c8;
          QString::fromUtf8(QVar16);
          local_158.d.d = (Data *)local_1c8._0_8_;
          local_158.d.ptr = (char16_t *)local_1c8._8_8_;
          local_158.d.size = local_1c8._16_8_;
          pQVar10 = QHash<QString,_QVariant>::operator[](&local_1a0,&local_158);
          uVar4 = uStack_180;
          uVar3 = local_198._16_8_;
          uVar2 = local_198._8_8_;
          uVar1 = local_198.shared;
          local_198.shared = (PrivateShared *)0x0;
          local_198._8_8_ = 0;
          local_198._16_8_ = 0;
          uStack_180 = 2;
          local_1c8._0_8_ = (pQVar10->d).data.shared;
          local_1c8._8_8_ = *(undefined8 *)((long)&(pQVar10->d).data + 8);
          local_1c8._16_8_ = *(undefined8 *)((long)&(pQVar10->d).data + 0x10);
          pQStack_1b0 = *(QVariant **)&(pQVar10->d).field_0x18;
          *(undefined8 *)((long)&(pQVar10->d).data + 0x10) = uVar3;
          *(undefined8 *)&(pQVar10->d).field_0x18 = uVar4;
          (pQVar10->d).data.shared = (PrivateShared *)uVar1;
          *(undefined8 *)((long)&(pQVar10->d).data + 8) = uVar2;
          local_138.shared = (PrivateShared *)local_1c8._0_8_;
          local_138._8_8_ = local_1c8._8_8_;
          local_138._16_8_ = local_1c8._16_8_;
          pQStack_120 = pQStack_1b0;
          ::QVariant::~QVariant((QVariant *)&local_138);
          if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,2,8);
            }
          }
          ::QVariant::~QVariant((QVariant *)&local_198);
          ::QVariant::QVariant((QVariant *)&local_138,(QHash *)&local_1a0);
          Mustache::QtVariantContext::QtVariantContext
                    ((QtVariantContext *)local_1c8,(QVariant *)&local_138,(PartialResolver *)0x0);
          local_198._16_8_ = local_f8.m_contextStack.super_QList<QVariant>.d.size;
          local_198._8_8_ = local_f8.m_contextStack.super_QList<QVariant>.d.ptr;
          local_198.shared = (PrivateShared *)local_f8.m_contextStack.super_QList<QVariant>.d.d;
          local_f8.m_contextStack.super_QList<QVariant>.d.size = (qsizetype)local_1a8;
          local_f8.m_contextStack.super_QList<QVariant>.d.ptr = pQStack_1b0;
          local_f8.super_Context.m_partialResolver = (PartialResolver *)local_1c8._8_8_;
          local_f8.m_contextStack.super_QList<QVariant>.d.d = (Data *)local_1c8._16_8_;
          local_1c8._16_8_ = (QArrayData *)0x0;
          pQStack_1b0 = (QVariant *)0x0;
          local_1a8 = (Data *)0x0;
          QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)&local_198)
          ;
          local_1c8._0_8_ = &PTR__QtVariantContext_00122c90;
          QArrayDataPointer<QVariant>::~QArrayDataPointer
                    ((QArrayDataPointer<QVariant> *)(local_1c8 + 0x10));
          ::QVariant::~QVariant((QVariant *)&local_138);
          Mustache::Renderer::render
                    ((QString *)local_1c8,&local_c8,&local_118,&local_f8.super_Context);
          qVar7 = local_170.d.size;
          pcVar6 = local_170.d.ptr;
          pDVar5 = local_170.d.d;
          local_170.d.d = (Data *)local_1c8._0_8_;
          local_1c8._0_8_ = pDVar5;
          local_170.d.ptr = (char16_t *)local_1c8._8_8_;
          local_170.d.size = local_1c8._16_8_;
          local_1c8._8_8_ = pcVar6;
          local_1c8._16_8_ = qVar7;
          if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&pDVar5->super_QArrayData,2,8);
            }
          }
          if ((QArrayData *)local_170.d.size == (QArrayData *)0x0) {
            cVar8 = QTest::qVerify(true,"output.isEmpty()","0.0 evaluated as truthy",
                                   "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                                   ,0xa4);
          }
          else {
            cVar8 = QTest::qVerify(false,"output.isEmpty()","0.0 evaluated as truthy",
                                   "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                                   ,0xa4);
          }
          if (cVar8 != '\0') {
            ::QVariant::QVariant((QVariant *)&local_198,0.4);
            QVar17.m_data = (storage_type *)0x4;
            QVar17.m_size = (qsizetype)local_1c8;
            QString::fromUtf8(QVar17);
            local_158.d.d = (Data *)local_1c8._0_8_;
            local_158.d.ptr = (char16_t *)local_1c8._8_8_;
            local_158.d.size = local_1c8._16_8_;
            pQVar10 = QHash<QString,_QVariant>::operator[](&local_1a0,&local_158);
            uVar4 = uStack_180;
            uVar3 = local_198._16_8_;
            uVar2 = local_198._8_8_;
            uVar1 = local_198.shared;
            local_198.shared = (PrivateShared *)0x0;
            local_198._8_8_ = 0;
            local_198._16_8_ = 0;
            uStack_180 = 2;
            local_1c8._0_8_ = (pQVar10->d).data.shared;
            local_1c8._8_8_ = *(undefined8 *)((long)&(pQVar10->d).data + 8);
            local_1c8._16_8_ = *(undefined8 *)((long)&(pQVar10->d).data + 0x10);
            pQStack_1b0 = *(QVariant **)&(pQVar10->d).field_0x18;
            *(undefined8 *)((long)&(pQVar10->d).data + 0x10) = uVar3;
            *(undefined8 *)&(pQVar10->d).field_0x18 = uVar4;
            (pQVar10->d).data.shared = (PrivateShared *)uVar1;
            *(undefined8 *)((long)&(pQVar10->d).data + 8) = uVar2;
            local_138.shared = (PrivateShared *)local_1c8._0_8_;
            local_138._8_8_ = local_1c8._8_8_;
            local_138._16_8_ = local_1c8._16_8_;
            pQStack_120 = pQStack_1b0;
            ::QVariant::~QVariant((QVariant *)&local_138);
            if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,2,8);
              }
            }
            ::QVariant::~QVariant((QVariant *)&local_198);
            ::QVariant::QVariant((QVariant *)&local_138,(QHash *)&local_1a0);
            Mustache::QtVariantContext::QtVariantContext
                      ((QtVariantContext *)local_1c8,(QVariant *)&local_138,(PartialResolver *)0x0);
            local_198._16_8_ = local_f8.m_contextStack.super_QList<QVariant>.d.size;
            local_198._8_8_ = local_f8.m_contextStack.super_QList<QVariant>.d.ptr;
            local_198.shared = (PrivateShared *)local_f8.m_contextStack.super_QList<QVariant>.d.d;
            local_f8.m_contextStack.super_QList<QVariant>.d.size = (qsizetype)local_1a8;
            local_f8.m_contextStack.super_QList<QVariant>.d.ptr = pQStack_1b0;
            local_f8.super_Context.m_partialResolver = (PartialResolver *)local_1c8._8_8_;
            local_f8.m_contextStack.super_QList<QVariant>.d.d = (Data *)local_1c8._16_8_;
            local_1c8._16_8_ = (QArrayData *)0x0;
            pQStack_1b0 = (QVariant *)0x0;
            local_1a8 = (Data *)0x0;
            QArrayDataPointer<QVariant>::~QArrayDataPointer
                      ((QArrayDataPointer<QVariant> *)&local_198);
            local_1c8._0_8_ = &PTR__QtVariantContext_00122c90;
            QArrayDataPointer<QVariant>::~QArrayDataPointer
                      ((QArrayDataPointer<QVariant> *)(local_1c8 + 0x10));
            ::QVariant::~QVariant((QVariant *)&local_138);
            Mustache::Renderer::render
                      ((QString *)local_1c8,&local_c8,&local_118,&local_f8.super_Context);
            qVar7 = local_170.d.size;
            pcVar6 = local_170.d.ptr;
            pDVar5 = local_170.d.d;
            local_170.d.d = (Data *)local_1c8._0_8_;
            local_1c8._0_8_ = pDVar5;
            local_170.d.ptr = (char16_t *)local_1c8._8_8_;
            local_170.d.size = local_1c8._16_8_;
            local_1c8._8_8_ = pcVar6;
            local_1c8._16_8_ = qVar7;
            if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&pDVar5->super_QArrayData,2,8);
              }
            }
            if ((QArrayData *)local_170.d.size == (QArrayData *)0x0) {
              cVar8 = QTest::qVerify(false,"!output.isEmpty()","0.4 evaluated as falsey",
                                     "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                                     ,0xaa);
            }
            else {
              cVar8 = QTest::qVerify(true,"!output.isEmpty()","0.4 evaluated as falsey",
                                     "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                                     ,0xaa);
            }
            if (cVar8 != '\0') {
              ::QVariant::QVariant((QVariant *)&local_198,0.5);
              QString::QString(&local_158,"bool");
              pQVar10 = QHash<QString,_QVariant>::operator[](&local_1a0,&local_158);
              uVar4 = uStack_180;
              uVar3 = local_198._16_8_;
              uVar2 = local_198._8_8_;
              uVar1 = local_198.shared;
              local_198.shared = (PrivateShared *)0x0;
              local_198._8_8_ = 0;
              local_198._16_8_ = 0;
              uStack_180 = 2;
              local_1c8._0_8_ = (pQVar10->d).data.shared;
              local_1c8._8_8_ = *(undefined8 *)((long)&(pQVar10->d).data + 8);
              local_1c8._16_8_ = *(undefined8 *)((long)&(pQVar10->d).data + 0x10);
              pQStack_1b0 = *(QVariant **)&(pQVar10->d).field_0x18;
              *(undefined8 *)((long)&(pQVar10->d).data + 0x10) = uVar3;
              *(undefined8 *)&(pQVar10->d).field_0x18 = uVar4;
              (pQVar10->d).data.shared = (PrivateShared *)uVar1;
              *(undefined8 *)((long)&(pQVar10->d).data + 8) = uVar2;
              local_138.shared = (PrivateShared *)local_1c8._0_8_;
              local_138._8_8_ = local_1c8._8_8_;
              local_138._16_8_ = local_1c8._16_8_;
              pQStack_120 = pQStack_1b0;
              ::QVariant::~QVariant((QVariant *)&local_138);
              if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,2,8);
                }
              }
              ::QVariant::~QVariant((QVariant *)&local_198);
              ::QVariant::QVariant((QVariant *)&local_138,(QHash *)&local_1a0);
              Mustache::QtVariantContext::QtVariantContext
                        ((QtVariantContext *)local_1c8,(QVariant *)&local_138,(PartialResolver *)0x0
                        );
              local_198._16_8_ = local_f8.m_contextStack.super_QList<QVariant>.d.size;
              local_198._8_8_ = local_f8.m_contextStack.super_QList<QVariant>.d.ptr;
              local_198.shared = (PrivateShared *)local_f8.m_contextStack.super_QList<QVariant>.d.d;
              local_f8.m_contextStack.super_QList<QVariant>.d.size = (qsizetype)local_1a8;
              local_f8.m_contextStack.super_QList<QVariant>.d.ptr = pQStack_1b0;
              local_f8.super_Context.m_partialResolver = (PartialResolver *)local_1c8._8_8_;
              local_f8.m_contextStack.super_QList<QVariant>.d.d = (Data *)local_1c8._16_8_;
              local_1c8._16_8_ = (QArrayData *)0x0;
              pQStack_1b0 = (QVariant *)0x0;
              local_1a8 = (Data *)0x0;
              QArrayDataPointer<QVariant>::~QArrayDataPointer
                        ((QArrayDataPointer<QVariant> *)&local_198);
              local_1c8._0_8_ = &PTR__QtVariantContext_00122c90;
              QArrayDataPointer<QVariant>::~QArrayDataPointer
                        ((QArrayDataPointer<QVariant> *)(local_1c8 + 0x10));
              ::QVariant::~QVariant((QVariant *)&local_138);
              Mustache::Renderer::render
                        ((QString *)local_1c8,&local_c8,&local_118,&local_f8.super_Context);
              qVar7 = local_170.d.size;
              pcVar6 = local_170.d.ptr;
              pDVar5 = local_170.d.d;
              local_170.d.d = (Data *)local_1c8._0_8_;
              local_1c8._0_8_ = pDVar5;
              local_170.d.ptr = (char16_t *)local_1c8._8_8_;
              local_170.d.size = local_1c8._16_8_;
              local_1c8._8_8_ = pcVar6;
              local_1c8._16_8_ = qVar7;
              if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&pDVar5->super_QArrayData,2,8);
                }
              }
              if ((QArrayData *)local_170.d.size == (QArrayData *)0x0) {
                cVar8 = QTest::qVerify(false,"!output.isEmpty()","0.5f evaluated as falsey",
                                       "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                                       ,0xb0);
              }
              else {
                cVar8 = QTest::qVerify(true,"!output.isEmpty()","0.5f evaluated as falsey",
                                       "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                                       ,0xb0);
              }
              if (cVar8 != '\0') {
                ::QVariant::QVariant((QVariant *)&local_198,0.0);
                QString::QString(&local_158,"bool");
                pQVar10 = QHash<QString,_QVariant>::operator[](&local_1a0,&local_158);
                uVar4 = uStack_180;
                uVar3 = local_198._16_8_;
                uVar2 = local_198._8_8_;
                uVar1 = local_198.shared;
                local_198.shared = (PrivateShared *)0x0;
                local_198._8_8_ = 0;
                local_198._16_8_ = 0;
                uStack_180 = 2;
                local_1c8._0_8_ = (pQVar10->d).data.shared;
                local_1c8._8_8_ = *(undefined8 *)((long)&(pQVar10->d).data + 8);
                local_1c8._16_8_ = *(undefined8 *)((long)&(pQVar10->d).data + 0x10);
                pQStack_1b0 = *(QVariant **)&(pQVar10->d).field_0x18;
                *(undefined8 *)((long)&(pQVar10->d).data + 0x10) = uVar3;
                *(undefined8 *)&(pQVar10->d).field_0x18 = uVar4;
                (pQVar10->d).data.shared = (PrivateShared *)uVar1;
                *(undefined8 *)((long)&(pQVar10->d).data + 8) = uVar2;
                local_138.shared = (PrivateShared *)local_1c8._0_8_;
                local_138._8_8_ = local_1c8._8_8_;
                local_138._16_8_ = local_1c8._16_8_;
                pQStack_120 = pQStack_1b0;
                ::QVariant::~QVariant((QVariant *)&local_138);
                if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,2,8);
                  }
                }
                ::QVariant::~QVariant((QVariant *)&local_198);
                ::QVariant::QVariant((QVariant *)&local_138,(QHash *)&local_1a0);
                Mustache::QtVariantContext::QtVariantContext
                          ((QtVariantContext *)local_1c8,(QVariant *)&local_138,
                           (PartialResolver *)0x0);
                local_198._16_8_ = local_f8.m_contextStack.super_QList<QVariant>.d.size;
                local_198._8_8_ = local_f8.m_contextStack.super_QList<QVariant>.d.ptr;
                local_198.shared =
                     (PrivateShared *)local_f8.m_contextStack.super_QList<QVariant>.d.d;
                local_f8.m_contextStack.super_QList<QVariant>.d.size = (qsizetype)local_1a8;
                local_f8.m_contextStack.super_QList<QVariant>.d.ptr = pQStack_1b0;
                local_f8.super_Context.m_partialResolver = (PartialResolver *)local_1c8._8_8_;
                local_f8.m_contextStack.super_QList<QVariant>.d.d = (Data *)local_1c8._16_8_;
                local_1c8._16_8_ = (QArrayData *)0x0;
                pQStack_1b0 = (QVariant *)0x0;
                local_1a8 = (Data *)0x0;
                QArrayDataPointer<QVariant>::~QArrayDataPointer
                          ((QArrayDataPointer<QVariant> *)&local_198);
                local_1c8._0_8_ = &PTR__QtVariantContext_00122c90;
                QArrayDataPointer<QVariant>::~QArrayDataPointer
                          ((QArrayDataPointer<QVariant> *)(local_1c8 + 0x10));
                ::QVariant::~QVariant((QVariant *)&local_138);
                Mustache::Renderer::render
                          ((QString *)local_1c8,&local_c8,&local_118,&local_f8.super_Context);
                qVar7 = local_170.d.size;
                pcVar6 = local_170.d.ptr;
                pDVar5 = local_170.d.d;
                local_170.d.d = (Data *)local_1c8._0_8_;
                local_1c8._0_8_ = pDVar5;
                local_170.d.ptr = (char16_t *)local_1c8._8_8_;
                local_170.d.size = local_1c8._16_8_;
                local_1c8._8_8_ = pcVar6;
                local_1c8._16_8_ = qVar7;
                if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&pDVar5->super_QArrayData,2,8);
                  }
                }
                if ((QArrayData *)local_170.d.size == (QArrayData *)0x0) {
                  cVar8 = QTest::qVerify(true,"output.isEmpty()","0.0f evaluated as truthy",
                                         "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                                         ,0xb6);
                }
                else {
                  cVar8 = QTest::qVerify(false,"output.isEmpty()","0.0f evaluated as truthy",
                                         "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                                         ,0xb6);
                }
                if (cVar8 != '\0') {
                  ::QVariant::QVariant((QVariant *)&local_198,0);
                  QString::QString(&local_158,"bool");
                  pQVar10 = QHash<QString,_QVariant>::operator[](&local_1a0,&local_158);
                  uVar4 = uStack_180;
                  uVar3 = local_198._16_8_;
                  uVar2 = local_198._8_8_;
                  uVar1 = local_198.shared;
                  local_198.shared = (PrivateShared *)0x0;
                  local_198._8_8_ = 0;
                  local_198._16_8_ = 0;
                  uStack_180 = 2;
                  local_1c8._0_8_ = (pQVar10->d).data.shared;
                  local_1c8._8_8_ = *(undefined8 *)((long)&(pQVar10->d).data + 8);
                  local_1c8._16_8_ = *(undefined8 *)((long)&(pQVar10->d).data + 0x10);
                  pQStack_1b0 = *(QVariant **)&(pQVar10->d).field_0x18;
                  *(undefined8 *)((long)&(pQVar10->d).data + 0x10) = uVar3;
                  *(undefined8 *)&(pQVar10->d).field_0x18 = uVar4;
                  (pQVar10->d).data.shared = (PrivateShared *)uVar1;
                  *(undefined8 *)((long)&(pQVar10->d).data + 8) = uVar2;
                  local_138.shared = (PrivateShared *)local_1c8._0_8_;
                  local_138._8_8_ = local_1c8._8_8_;
                  local_138._16_8_ = local_1c8._16_8_;
                  pQStack_120 = pQStack_1b0;
                  ::QVariant::~QVariant((QVariant *)&local_138);
                  if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                         = ((local_158.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,2,8);
                    }
                  }
                  ::QVariant::~QVariant((QVariant *)&local_198);
                  ::QVariant::QVariant((QVariant *)&local_138,(QHash *)&local_1a0);
                  Mustache::QtVariantContext::QtVariantContext
                            ((QtVariantContext *)local_1c8,(QVariant *)&local_138,
                             (PartialResolver *)0x0);
                  local_198._16_8_ = local_f8.m_contextStack.super_QList<QVariant>.d.size;
                  local_198._8_8_ = local_f8.m_contextStack.super_QList<QVariant>.d.ptr;
                  local_198.shared =
                       (PrivateShared *)local_f8.m_contextStack.super_QList<QVariant>.d.d;
                  local_f8.m_contextStack.super_QList<QVariant>.d.size = (qsizetype)local_1a8;
                  local_f8.m_contextStack.super_QList<QVariant>.d.ptr = pQStack_1b0;
                  local_f8.super_Context.m_partialResolver = (PartialResolver *)local_1c8._8_8_;
                  local_f8.m_contextStack.super_QList<QVariant>.d.d = (Data *)local_1c8._16_8_;
                  local_1c8._16_8_ = (QArrayData *)0x0;
                  pQStack_1b0 = (QVariant *)0x0;
                  local_1a8 = (Data *)0x0;
                  QArrayDataPointer<QVariant>::~QArrayDataPointer
                            ((QArrayDataPointer<QVariant> *)&local_198);
                  local_1c8._0_8_ = &PTR__QtVariantContext_00122c90;
                  QArrayDataPointer<QVariant>::~QArrayDataPointer
                            ((QArrayDataPointer<QVariant> *)(local_1c8 + 0x10));
                  ::QVariant::~QVariant((QVariant *)&local_138);
                  Mustache::Renderer::render
                            ((QString *)local_1c8,&local_c8,&local_118,&local_f8.super_Context);
                  qVar7 = local_170.d.size;
                  pcVar6 = local_170.d.ptr;
                  pDVar5 = local_170.d.d;
                  local_170.d.d = (Data *)local_1c8._0_8_;
                  local_1c8._0_8_ = pDVar5;
                  local_170.d.ptr = (char16_t *)local_1c8._8_8_;
                  local_170.d.size = local_1c8._16_8_;
                  local_1c8._8_8_ = pcVar6;
                  local_1c8._16_8_ = qVar7;
                  if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
                    ;
                    UNLOCK();
                    if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
                    {
                      QArrayData::deallocate(&pDVar5->super_QArrayData,2,8);
                    }
                  }
                  if ((QArrayData *)local_170.d.size == (QArrayData *)0x0) {
                    cVar8 = QTest::qVerify(true,"output.isEmpty()","\'",
                                           "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                                           ,0xbc);
                  }
                  else {
                    cVar8 = QTest::qVerify(false,"output.isEmpty()","\'",
                                           "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                                           ,0xbc);
                  }
                  if (cVar8 != '\0') {
                    ::QVariant::QVariant((QVariant *)&local_198,false);
                    QString::QString(&local_158,"bool");
                    pQVar10 = QHash<QString,_QVariant>::operator[](&local_1a0,&local_158);
                    uVar4 = uStack_180;
                    uVar3 = local_198._16_8_;
                    uVar2 = local_198._8_8_;
                    uVar1 = local_198.shared;
                    local_198.shared = (PrivateShared *)0x0;
                    local_198._8_8_ = 0;
                    local_198._16_8_ = 0;
                    uStack_180 = 2;
                    local_1c8._0_8_ = (pQVar10->d).data.shared;
                    local_1c8._8_8_ = *(undefined8 *)((long)&(pQVar10->d).data + 8);
                    local_1c8._16_8_ = *(undefined8 *)((long)&(pQVar10->d).data + 0x10);
                    pQStack_1b0 = *(QVariant **)&(pQVar10->d).field_0x18;
                    *(undefined8 *)((long)&(pQVar10->d).data + 0x10) = uVar3;
                    *(undefined8 *)&(pQVar10->d).field_0x18 = uVar4;
                    (pQVar10->d).data.shared = (PrivateShared *)uVar1;
                    *(undefined8 *)((long)&(pQVar10->d).data + 8) = uVar2;
                    local_138.shared = (PrivateShared *)local_1c8._0_8_;
                    local_138._8_8_ = local_1c8._8_8_;
                    local_138._16_8_ = local_1c8._16_8_;
                    pQStack_120 = pQStack_1b0;
                    ::QVariant::~QVariant((QVariant *)&local_138);
                    if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_158.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,2,8);
                      }
                    }
                    ::QVariant::~QVariant((QVariant *)&local_198);
                    ::QVariant::QVariant((QVariant *)&local_138,(QHash *)&local_1a0);
                    Mustache::QtVariantContext::QtVariantContext
                              ((QtVariantContext *)local_1c8,(QVariant *)&local_138,
                               (PartialResolver *)0x0);
                    local_198._16_8_ = local_f8.m_contextStack.super_QList<QVariant>.d.size;
                    local_198._8_8_ = local_f8.m_contextStack.super_QList<QVariant>.d.ptr;
                    local_198.shared =
                         (PrivateShared *)local_f8.m_contextStack.super_QList<QVariant>.d.d;
                    local_f8.m_contextStack.super_QList<QVariant>.d.size = (qsizetype)local_1a8;
                    local_f8.m_contextStack.super_QList<QVariant>.d.ptr = pQStack_1b0;
                    local_f8.super_Context.m_partialResolver = (PartialResolver *)local_1c8._8_8_;
                    local_f8.m_contextStack.super_QList<QVariant>.d.d = (Data *)local_1c8._16_8_;
                    local_1c8._16_8_ = (QArrayData *)0x0;
                    pQStack_1b0 = (QVariant *)0x0;
                    local_1a8 = (Data *)0x0;
                    QArrayDataPointer<QVariant>::~QArrayDataPointer
                              ((QArrayDataPointer<QVariant> *)&local_198);
                    local_1c8._0_8_ = &PTR__QtVariantContext_00122c90;
                    QArrayDataPointer<QVariant>::~QArrayDataPointer
                              ((QArrayDataPointer<QVariant> *)(local_1c8 + 0x10));
                    ::QVariant::~QVariant((QVariant *)&local_138);
                    Mustache::Renderer::render
                              ((QString *)local_1c8,&local_c8,&local_118,&local_f8.super_Context);
                    qVar7 = local_170.d.size;
                    pcVar6 = local_170.d.ptr;
                    pDVar5 = local_170.d.d;
                    local_170.d.d = (Data *)local_1c8._0_8_;
                    local_1c8._0_8_ = pDVar5;
                    local_170.d.ptr = (char16_t *)local_1c8._8_8_;
                    local_170.d.size = local_1c8._16_8_;
                    local_1c8._8_8_ = pcVar6;
                    local_1c8._16_8_ = qVar7;
                    if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                           (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                           -1;
                      UNLOCK();
                      if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                          0) {
                        QArrayData::deallocate(&pDVar5->super_QArrayData,2,8);
                      }
                    }
                    QTest::qVerify((QArrayData *)local_170.d.size == (QArrayData *)0x0,
                                   "output.isEmpty()","\'",
                                   "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                                   ,0xc2);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (&(local_170.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_170.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_170.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_170.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_170.d.d)->super_QArrayData,2,8);
    }
  }
  local_f8.super_Context._vptr_Context = (_func_int **)&PTR__QtVariantContext_00122c90;
  QArrayDataPointer<QVariant>::~QArrayDataPointer
            ((QArrayDataPointer<QVariant> *)&local_f8.m_contextStack);
  if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,8);
    }
  }
  QHash<QString,_QVariant>::~QHash(&local_1a0);
  Mustache::Renderer::~Renderer(&local_c8);
  return;
}

Assistant:

void TestMustache::testFalsiness()
{
	Mustache::Renderer renderer;
	QVariantHash data;
	QString _template = "{{#bool}}This should not be shown{{/bool}}";

	// test falsiness of 0
	data["bool"] = 0;
	Mustache::QtVariantContext context = Mustache::QtVariantContext(data);
	QString output = renderer.render(_template, &context);
	QVERIFY2(output.isEmpty(), "0 evaluated as truthy");

	// test falsiness of 0u
	data["bool"] = 0u;
	context = Mustache::QtVariantContext(data);
	output = renderer.render(_template, &context);
	QVERIFY2(output.isEmpty(), "0u evaluated as truthy");

	// test falsiness of 0ll
	data["bool"] = 0ll;
	context = Mustache::QtVariantContext(data);
	output = renderer.render(_template, &context);
	QVERIFY2(output.isEmpty(), "0ll evaluated as truthy");

	// test falsiness of 0ull
	data["bool"] = 0ull;
	context = Mustache::QtVariantContext(data);
	output = renderer.render(_template, &context);
	QVERIFY2(output.isEmpty(), "0ull evaluated as truthy");

	// test falsiness of 0.0
	data["bool"] = 0.0;
	context = Mustache::QtVariantContext(data);
	output = renderer.render(_template, &context);
	QVERIFY2(output.isEmpty(), "0.0 evaluated as truthy");

	// test falsiness of 0.4
	data["bool"] = 0.4f;
	context = Mustache::QtVariantContext(data);
	output = renderer.render(_template, &context);
	QVERIFY2(!output.isEmpty(), "0.4 evaluated as falsey");

	// test falsiness of 0.5
	data["bool"] = 0.5f;
	context = Mustache::QtVariantContext(data);
	output = renderer.render(_template, &context);
	QVERIFY2(!output.isEmpty(), "0.5f evaluated as falsey");

	// test falsiness of 0.0f
	data["bool"] = 0.0f;
	context = Mustache::QtVariantContext(data);
	output = renderer.render(_template, &context);
	QVERIFY2(output.isEmpty(), "0.0f evaluated as truthy");

	// test falsiness of '\0'
	data["bool"] = '\0';
	context = Mustache::QtVariantContext(data);
	output = renderer.render(_template, &context);
	QVERIFY2(output.isEmpty(), "'\0' evaluated as truthy");

	// test falsiness of 'false'
	data["bool"] = false;
	context = Mustache::QtVariantContext(data);
	output = renderer.render(_template, &context);
	QVERIFY2(output.isEmpty(), "'\0' evaluated as truthy");
}